

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallFilesGenerator::GenerateScriptActions
          (cmInstallFilesGenerator *this,ostream *os,Indent indent)

{
  allocator<char> local_41;
  string local_40;
  
  if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions((cmScriptGenerator *)this,os,indent);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  AddFilesInstallRule(this,os,&local_40,indent,&this->Files);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmInstallFilesGenerator::GenerateScriptActions(std::ostream& os,
                                                    Indent indent)
{
  if (this->ActionsPerConfig) {
    this->cmInstallGenerator::GenerateScriptActions(os, indent);
  } else {
    this->AddFilesInstallRule(os, "", indent, this->Files);
  }
}